

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O2

void __thiscall
google::protobuf::internal::
MethodClosure1<google::protobuf::(anonymous_namespace)::ClosureTest,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::Run(MethodClosure1<google::protobuf::(anonymous_namespace)::ClosureTest,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      *this)

{
  bool bVar1;
  code *pcVar2;
  long *plVar3;
  string asStack_48 [32];
  
  pcVar2 = (code *)this->method_;
  plVar3 = (long *)((long)&(this->object_->super_Test)._vptr_Test + *(long *)&this->field_0x18);
  if (((ulong)pcVar2 & 1) != 0) {
    pcVar2 = *(code **)(pcVar2 + *plVar3 + -1);
  }
  bVar1 = this->self_deleting_;
  std::__cxx11::string::string(asStack_48,(string *)&this->arg1_);
  (*pcVar2)(plVar3,asStack_48);
  std::__cxx11::string::~string(asStack_48);
  if (bVar1 != false) {
    (*(this->super_Closure)._vptr_Closure[1])(this);
  }
  return;
}

Assistant:

void Run() override {
    bool needs_delete = self_deleting_;  // read in case callback deletes
    (object_->*method_)(arg1_);
    if (needs_delete) delete this;
  }